

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::ExecutionInfoManager::GetLastExecutedTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  TTLastReturnLocationInfo *this_00;
  FunctionBody *this_01;
  int64 etime;
  uint64 ftime;
  uint64 ltime;
  uint startOffset;
  SingleCallCounter *pSVar1;
  LONG local_38;
  ULONG local_34;
  LONG srcColumn;
  ULONG srcLine;
  
  if ((this->m_lastReturnLocation).m_lastFrame.Function == (FunctionBody *)0x0) {
    sourceLocation->m_sourceScriptLogId = 0;
    *(undefined4 *)&sourceLocation->m_bpId = 0xffffffff;
    *(undefined4 *)((long)&sourceLocation->m_bpId + 4) = 0xffffffff;
    *(undefined4 *)&sourceLocation->m_etime = 0xffffffff;
    *(undefined4 *)((long)&sourceLocation->m_etime + 4) = 0xffffffff;
    sourceLocation->m_ftime = 0;
    sourceLocation->m_ltime = 0;
    sourceLocation->m_topLevelBodyId = 0;
    sourceLocation->m_functionLine = 0;
    sourceLocation->m_functionColumn = 0;
    sourceLocation->m_line = 0;
    sourceLocation->m_column = 0;
  }
  else {
    this_00 = &this->m_lastReturnLocation;
    local_34 = 0;
    local_38 = -1;
    pSVar1 = TTLastReturnLocationInfo::GetLocation(this_00);
    this_01 = pSVar1->Function;
    pSVar1 = TTLastReturnLocationInfo::GetLocation(this_00);
    startOffset = Js::FunctionBody::GetStatementStartOffset(this_01,pSVar1->CurrentStatementIndex);
    pSVar1 = TTLastReturnLocationInfo::GetLocation(this_00);
    Js::FunctionBody::GetSourceLineFromStartOffset_TTD
              (pSVar1->Function,startOffset,&local_34,&local_38);
    etime = this->m_topLevelCallbackEventTime;
    pSVar1 = TTLastReturnLocationInfo::GetLocation(this_00);
    ftime = pSVar1->FunctionTime;
    pSVar1 = TTLastReturnLocationInfo::GetLocation(this_00);
    ltime = pSVar1->CurrentStatementLoopTime;
    pSVar1 = TTLastReturnLocationInfo::GetLocation(this_00);
    TTDebuggerSourceLocation::SetLocationFull
              (sourceLocation,etime,ftime,ltime,pSVar1->Function,local_34,local_38);
  }
  return;
}

Assistant:

void ExecutionInfoManager::GetLastExecutedTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        const TTLastReturnLocationInfo& cframe = this->m_lastReturnLocation;

        if(!cframe.IsDefined())
        {
            sourceLocation.Clear();
            return;
        }
        else
        {
            ULONG srcLine = 0;
            LONG srcColumn = -1;
            uint32 startOffset = cframe.GetLocation().Function->GetStatementStartOffset(cframe.GetLocation().CurrentStatementIndex);
            cframe.GetLocation().Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

            sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, cframe.GetLocation().FunctionTime, cframe.GetLocation().CurrentStatementLoopTime, cframe.GetLocation().Function, srcLine, srcColumn);
        }
    }